

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
::GetNumElConnected(TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                    *this,TPZVec<int> *numelconnected)

{
  TPZEquationFilter *this_00;
  TPZCompMesh *pTVar1;
  TNode *pTVar2;
  int iVar3;
  TPZConnect *pTVar4;
  int64_t size;
  long nelem;
  int64_t ind;
  long lVar5;
  long lVar6;
  TPZManVector<long,_10> destindex;
  TPZManVector<long,_10> firstind;
  
  (**(code **)(*(long *)(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
                        fMesh + 0x78))();
  this_00 = &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
             fEquationFilter;
  nelem = 0;
  do {
    pTVar1 = (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh;
    if ((pTVar1->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements <= nelem) {
      return;
    }
    pTVar4 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(pTVar1->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
    if (((pTVar4->fDependList == (TPZDepend *)0x0) &&
        ((pTVar4->field_2).fCompose.fIsCondensed == false)) && (-1 < pTVar4->fSequenceNumber)) {
      iVar3 = (int)pTVar4->fSequenceNumber;
      pTVar2 = (((this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh)
               ->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      lVar5 = (long)pTVar2[iVar3].pos;
      lVar6 = (long)pTVar2[iVar3].dim;
      size = TPZEquationFilter::NumActive(this_00,lVar5,lVar6 + lVar5);
      if (size != 0) {
        if (size != lVar6) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZFrontStructMatrix.cpp"
                     ,0x27);
        }
        TPZManVector<long,_10>::TPZManVector(&firstind,size);
        TPZManVector<long,_10>::TPZManVector(&destindex,size);
        if (size < 1) {
          size = 0;
        }
        for (lVar6 = 0; size != lVar6; lVar6 = lVar6 + 1) {
          firstind.super_TPZVec<long>.fStore[lVar6] = lVar6;
          destindex.super_TPZVec<long>.fStore[lVar6] = lVar5 + lVar6;
        }
        TPZEquationFilter::Filter
                  (this_00,&firstind.super_TPZVec<long>,&destindex.super_TPZVec<long>);
        for (lVar5 = 0; lVar5 < destindex.super_TPZVec<long>.fNElements; lVar5 = lVar5 + 1) {
          pTVar4 = TPZChunkVector<TPZConnect,_10>::operator[]
                             (&(((this->super_TPZStructMatrixT<std::complex<double>_>).
                                 super_TPZStructMatrix.fMesh)->fConnectVec).
                               super_TPZChunkVector<TPZConnect,_10>,nelem);
          numelconnected->fStore[destindex.super_TPZVec<long>.fStore[lVar5]] = pTVar4->fNElConnected
          ;
        }
        TPZManVector<long,_10>::~TPZManVector(&destindex);
        TPZManVector<long,_10>::~TPZManVector(&firstind);
      }
    }
    nelem = nelem + 1;
  } while( true );
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::GetNumElConnected(TPZVec <int> &numelconnected){
	int64_t ic;
	
	this->fMesh->ComputeNodElCon();
	
	for(ic=0; ic<this->fMesh->ConnectVec().NElements(); ic++) {
		TPZConnect &cn = this->fMesh->ConnectVec()[ic];
		if(cn.HasDependency() || cn.IsCondensed()) continue;
		int64_t seqn = cn.SequenceNumber();
		if(seqn < 0) continue;
		int64_t firsteq = this->fMesh->Block().Position(seqn);
		int64_t lasteq = firsteq+this->fMesh->Block().Size(seqn);
        int64_t numactive = this->fEquationFilter.NumActive(firsteq, lasteq);
		if(!numactive) continue;
        if (numactive != lasteq-firsteq) {
            DebugStop();
        }
        TPZManVector<int64_t> firstind(numactive),destindex(numactive);
        for (int64_t i = 0; i<numactive; i++) {
            firstind[i] = i;
            destindex[i] = firsteq+i;
        }
        this->fEquationFilter.Filter(firstind, destindex);
		for(int64_t ind=0;ind<destindex.size();ind++) 
			numelconnected[destindex[ind] ] = this->fMesh->ConnectVec()[ic].NElConnected();
	}
}